

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  pointer *ppRVar1;
  undefined8 *puVar2;
  Index IVar3;
  char *pcVar4;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  pointer pSVar11;
  long lVar12;
  undefined4 uVar13;
  mapped_type mVar14;
  pointer pSVar15;
  pointer pRVar16;
  ulong uVar17;
  pointer pRVar18;
  ulong uVar19;
  pointer pSVar20;
  unsigned_long local_80;
  size_t offset;
  key_type local_70;
  size_t local_50;
  char *local_48;
  pointer local_40;
  RelocType local_38;
  Index local_34;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_38 = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    if (0xb < (long)(int)this->last_section_type_) {
      __assert_fail("static_cast<int>(sec) < kBinarySectionCount",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary.h"
                    ,0x4d,"const char *wabt::GetSectionName(BinarySection)");
    }
    pcVar4 = *(char **)(g_section_name + (long)(int)this->last_section_type_ * 8);
    pRVar5 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar5 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar16 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pRVar5 - (long)pRVar16 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar12 = (long)pRVar5 - (long)pRVar16 >> 3;
      uVar19 = lVar12 * -0x3333333333333333;
      uVar10 = 1;
      if (pRVar5 != pRVar16) {
        uVar10 = uVar19;
      }
      uVar17 = uVar10 + uVar19;
      if (0x333333333333332 < uVar17) {
        uVar17 = 0x333333333333333;
      }
      if (CARRY8(uVar10,uVar19)) {
        uVar17 = 0x333333333333333;
      }
      local_48 = desc;
      local_34 = index;
      if (uVar17 == 0) {
        pRVar6 = (pointer)0x0;
      }
      else {
        local_40 = pRVar16;
        pRVar6 = (pointer)operator_new(uVar17 * 0x28);
        pRVar16 = local_40;
      }
      IVar3 = this->section_count_;
      (&pRVar6->name)[lVar12] = pcVar4;
      (&pRVar6->section_index)[lVar12 * 2] = IVar3;
      puVar2 = (undefined8 *)
               ((long)&(pRVar6->relocations).
                       super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl +
               lVar12 * 8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)
       ((long)&(pRVar6->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
               _M_impl + lVar12 * 8 + 0x10) = 0;
      pRVar18 = pRVar6;
      for (pRVar7 = pRVar16; pRVar5 != pRVar7; pRVar7 = pRVar7 + 1) {
        pRVar18->section_index = pRVar7->section_index;
        pRVar18->name = pRVar7->name;
        (pRVar18->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(pRVar18->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 8) =
             (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(pRVar18->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 0x10) =
             (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar7->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar18 = pRVar18 + 1;
      }
      if (pRVar16 != (pointer)0x0) {
        operator_delete(pRVar16);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar6;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar18 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar6 + uVar17;
      desc = local_48;
      index = local_34;
    }
    else {
      IVar3 = this->section_count_;
      pRVar5->name = pcVar4;
      pRVar5->section_index = IVar3;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar5->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppRVar1 = &(this->reloc_sections_).
                 super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
    this->current_reloc_section_ =
         (this->reloc_sections_).
         super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  local_80 = this->stream_->offset_ - this->last_section_payload_offset_;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (local_38 == First) {
    uVar13 = 0;
    std::__cxx11::string::_M_assign
              ((string *)&local_70,
               (string *)
               (this->module_->funcs).
               super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
               super__Vector_impl_data._M_start[index]);
  }
  else {
    uVar13 = 2;
    std::__cxx11::string::_M_assign
              ((string *)&local_70,
               (string *)
               (this->module_->globals).
               super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
               super__Vector_impl_data._M_start[index]);
  }
  iVar8 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->symtab_)._M_h,&local_70);
  if (iVar8.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_40 = (pointer)CONCAT44(local_40._4_4_,uVar13);
    pSVar11 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pSVar15 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->symtab_,&local_70);
    mVar14 = (int)((ulong)((long)pSVar11 - (long)pSVar15) >> 2) * -0x55555555;
    *pmVar9 = mVar14;
    pSVar11 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar11 ==
        (this->symbols_).
        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pSVar15 = (this->symbols_).
                super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_50 = (long)pSVar11 - (long)pSVar15;
      local_48 = desc;
      local_34 = index;
      if (local_50 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar12 = (long)local_50 >> 2;
      uVar19 = lVar12 * -0x5555555555555555;
      uVar10 = 1;
      if (pSVar11 != pSVar15) {
        uVar10 = uVar19;
      }
      uVar17 = uVar10 + uVar19;
      if (0xaaaaaaaaaaaaaa9 < uVar17) {
        uVar17 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar10,uVar19)) {
        uVar17 = 0xaaaaaaaaaaaaaaa;
      }
      if (uVar17 == 0) {
        pSVar11 = (pointer)0x0;
      }
      else {
        offset = (size_t)pSVar15;
        pSVar11 = (pointer)operator_new(uVar17 * 0xc);
        pSVar15 = (pointer)offset;
      }
      (&pSVar11->symbol_index)[lVar12] = mVar14;
      (&pSVar11->type)[lVar12] = (SymbolType)local_40;
      (&pSVar11->element_index)[lVar12] = local_34;
      if (0 < (long)local_50) {
        memmove(pSVar11,pSVar15,local_50);
      }
      pSVar20 = (pointer)((long)&pSVar11[1].symbol_index + local_50);
      if (pSVar15 != (pointer)0x0) {
        operator_delete(pSVar15);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar11;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar20;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar11 + uVar17;
      desc = local_48;
      index = local_34;
    }
    else {
      pSVar11->symbol_index = mVar14;
      pSVar11->type = (SymbolType)local_40;
      pSVar11->element_index = index;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar11 + 1;
    }
  }
  else {
    mVar14 = *(mapped_type *)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p._0_4_ = mVar14;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_38,&local_80,(uint *)&local_70);
  WriteFixedU32Leb128(this->stream_,index,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}